

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makedefs.c
# Opt level: O1

void do_dungeon(char *infile,char *outfile)

{
  uchar uVar1;
  bool bVar2;
  bool bVar3;
  permonst *ppVar4;
  FILE *pFVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  undefined8 extraout_RAX;
  char *pcVar11;
  long lVar12;
  byte *pbVar13;
  char *extraout_RAX_00;
  char cVar14;
  long lVar15;
  undefined8 uVar16;
  byte *pbVar17;
  long *plVar18;
  char *__filename;
  uint uVar19;
  ulong uVar20;
  msghdr *__filename_00;
  int *unaff_RBP;
  byte bVar21;
  byte bVar22;
  char *pcVar23;
  char *pcVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  uint uVar29;
  char *unaff_R12;
  deflist *unaff_R13;
  permonst *ppVar30;
  char cVar31;
  msghdr *unaff_R15;
  msghdr *__filename_01;
  char (*__s2) [3];
  char acStack_658 [256];
  long alStack_558 [33];
  char *pcStack_450;
  char *pcStack_448;
  deflist *pdStack_440;
  char *pcStack_438;
  msghdr *pmStack_430;
  code *pcStack_428;
  char *pcStack_420;
  msghdr *pmStack_418;
  char *pcStack_410;
  deflist *pdStack_408;
  char *pcStack_400;
  msghdr *pmStack_3f8;
  code *pcStack_3f0;
  int iStack_3dc;
  deflist adStack_3d8 [16];
  char *pcStack_2d0;
  char *pcStack_2c8;
  deflist *pdStack_2c0;
  char *pcStack_2b8;
  msghdr *pmStack_2b0;
  code *pcStack_2a8;
  ulong uStack_298;
  char *pcStack_290;
  deflist *pdStack_288;
  char *pcStack_280;
  msghdr *pmStack_278;
  code *pcStack_270;
  time_t tStack_260;
  char acStack_258 [64];
  char acStack_218 [64];
  undefined1 auStack_1d8 [64];
  char acStack_198 [256];
  char *pcStack_98;
  char *pcStack_90;
  deflist *pdStack_88;
  char *pcStack_80;
  msghdr *pmStack_78;
  undefined8 uStack_70;
  char *pcStack_68;
  char *pcStack_60;
  deflist *pdStack_58;
  char *pcStack_50;
  msghdr *pmStack_48;
  code *pcStack_40;
  
  pcStack_40 = (code *)0x10a079;
  ifp = (FILE *)fopen(infile,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010a1bc:
    pcStack_40 = (code *)0x10a1c4;
    do_dungeon_cold_3();
  }
  else {
    pcStack_40 = (code *)0x10a098;
    ofp = (FILE *)fopen(outfile,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      pcStack_40 = (code *)0x10a0b7;
      fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
      outfile = in_line;
      pcStack_40 = (code *)0x10a0d2;
      pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
      if (pcVar9 != (char *)0x0) {
        unaff_R15 = (msghdr *)0x4e5241434e494552;
        unaff_RBP = (int *)0x1;
        unaff_R12 = (char *)0x4e4f4954414e5241;
        unaff_R13 = deflist;
        do {
          if (in_line[0] != '#') {
            pcVar9 = in_line;
            if (in_line[0] == '%') {
              if (CONCAT53(in_line._9_5_,in_line._6_3_) != 0x4e4f4954414e5241 ||
                  CONCAT44(in_line._5_4_,
                           CONCAT13(in_line[4],CONCAT12(in_line[3],CONCAT11(in_line[2],in_line[1])))
                          ) != 0x4e5241434e494552) {
                pcStack_40 = (code *)0x10a1bc;
                do_dungeon_cold_1();
                goto LAB_0010a1bc;
              }
              pcStack_40 = (code *)0x10a15a;
              sVar10 = strlen(deflist[-(ulong)(CONCAT53(in_line._9_5_,in_line._6_3_) !=
                                               0x4e4f4954414e5241 ||
                                              CONCAT44(in_line._5_4_,
                                                       CONCAT13(in_line[4],
                                                                CONCAT12(in_line[3],
                                                                         CONCAT11(in_line[2],
                                                                                  in_line[1])))) !=
                                              0x4e5241434e494552)].defname);
              pcVar9 = in_line + sVar10 + 1;
            }
            pcStack_40 = (code *)0x10a16d;
            fputs(pcVar9,(FILE *)ofp);
          }
          pcStack_40 = (code *)0x10a181;
          pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
          unaff_RBP = (int *)(ulong)((int)unaff_RBP + 1);
        } while (pcVar9 != (char *)0x0);
      }
      pcStack_40 = (code *)0x10a198;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_40 = do_monstr;
  pcVar9 = outfile;
  do_dungeon_cold_2();
  pcVar23 = "w+";
  pmStack_78 = (msghdr *)0x10a1e6;
  uStack_70 = extraout_RAX;
  pcStack_68 = infile;
  pcStack_60 = unaff_R12;
  pdStack_58 = unaff_R13;
  pcStack_50 = outfile;
  pmStack_48 = unaff_R15;
  pcStack_40 = (code *)unaff_RBP;
  ofp = (FILE *)fopen(pcVar9,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    pmStack_78 = (msghdr *)0x10a205;
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    pmStack_78 = (msghdr *)0x10a222;
    fwrite("#include \"config.h\"\n",0x14,1,(FILE *)ofp);
    pmStack_78 = (msghdr *)0x10a23f;
    fwrite("\nconst int monstr[] = {\n",0x18,1,(FILE *)ofp);
    ppVar30 = mons;
    uVar19 = 0;
    do {
      uVar6 = (uint)ppVar30->mlevel;
      uVar29 = uVar6 * 2 - 0xc >> 2;
      if ((int)uVar6 < 0x32) {
        uVar29 = uVar6;
      }
      lVar15 = 4;
      do {
        iVar7 = 1;
        uVar6 = (uint)ppVar30->mattk[lVar15 + -4].aatyp;
        if ((0xfd < uVar6) || ((0x9400U >> (uVar6 & 0x1f) & 1) != 0)) goto LAB_0010a2b3;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 10);
      iVar7 = 0;
LAB_0010a2b3:
      uStack_70 = CONCAT44(uVar19,(undefined4)uStack_70);
      uVar19 = (uint)('\x11' < ppVar30->mmove) +
               (uint)((byte)ppVar30->ac >> 7) +
               (ppVar30->geno >> 5 & 2 | ppVar30->geno >> 7 & 1) + iVar7 +
               (uint)(ppVar30->ac < '\x04');
      lVar15 = 4;
      do {
        uVar1 = ppVar30->mattk[lVar15 + -4].aatyp;
        uVar6 = 0;
        if (uVar1 == 0xfe) {
          uVar6 = ppVar30->mflags2 >> 0x1a & 1;
        }
        uVar19 = ((uVar19 + 1) - (uint)(uVar1 == '\0')) + (uint)(uVar1 == 0xff) + uVar6;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 10);
      lVar15 = 0x13;
      do {
        bVar22 = *(byte *)((long)ppVar30->mattk + lVar15 + -0x12);
        if ((bVar22 < 0x20) && ((0xe0048080U >> (bVar22 & 0x1f) & 1) != 0)) {
          uVar19 = uVar19 + 2;
        }
        else {
          pmStack_78 = (msghdr *)0x10a361;
          iVar7 = strcmp(ppVar30->mname,"grid bug");
          if (iVar7 != 0) {
            uVar19 = (uVar19 + 1) - (uint)(bVar22 == 0);
          }
        }
        uVar19 = (uVar19 + 1) -
                 (uint)((uint)*(byte *)((long)ppVar30->mattk + lVar15 + -0x11) *
                        (uint)*(byte *)((long)&((permonst *)(ppVar30->mattk + -4))->mname + lVar15)
                       < 0x18);
        lVar15 = lVar15 + 4;
      } while (lVar15 != 0x2b);
      pmStack_78 = (msghdr *)0x10a37e;
      iVar7 = strcmp(ppVar30->mname,"leprechaun");
      uVar6 = uVar19 - 2;
      if (iVar7 != 0) {
        uVar6 = uVar19;
      }
      if (uVar6 == 0) {
        uVar29 = uVar29 - 1;
      }
      else if ((int)uVar6 < 6) {
        uVar29 = uVar29 + (int)uVar6 / 3 + 1;
      }
      else {
        uVar29 = uVar29 + (uVar6 >> 1);
      }
      if ((int)uVar29 < 1) {
        uVar29 = 0;
      }
      uVar19 = uStack_70._4_4_ + 1;
      uVar16 = 0x20;
      if ((uVar19 & 0xf) == 0) {
        uVar16 = 10;
      }
      pmStack_78 = (msghdr *)0x10a3f6;
      fprintf((FILE *)ofp,"%2d,%c",(ulong)uVar29,uVar16);
      ppVar4 = ppVar30 + 1;
      ppVar30 = ppVar30 + 1;
      if (ppVar4->mlet == '\0') {
        pcVar9 = "\n";
        if ((uVar19 & 0xf) == 0) {
          pcVar9 = "";
        }
        pmStack_78 = (msghdr *)0x10a43d;
        fprintf((FILE *)ofp,"%s};\n",pcVar9);
        pmStack_78 = (msghdr *)0x10a45a;
        fwrite("\n/*monstr.c*/\n",0xe,1,(FILE *)ofp);
        fclose((FILE *)ofp);
        return;
      }
    } while( true );
  }
  pmStack_78 = (msghdr *)do_date;
  pcVar11 = pcVar9;
  do_monstr_cold_1();
  tStack_260 = 0;
  pcStack_270 = (code *)0x10a4a6;
  pcStack_98 = pcVar9;
  pcStack_90 = unaff_R12;
  pdStack_88 = unaff_R13;
  pcStack_80 = outfile;
  pmStack_78 = unaff_R15;
  ofp = (FILE *)fopen(pcVar11,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    pcStack_270 = (code *)0x10a4c5;
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    pcStack_270 = (code *)0x10a4d2;
    time(&tStack_260);
    pcStack_270 = (code *)0x10a4da;
    pcVar11 = ctime(&tStack_260);
    pcVar9 = acStack_258;
    pcStack_270 = (code *)0x10a4ea;
    strcpy(pcVar9,pcVar11);
    for (; (*pcVar9 != '\0' && (*pcVar9 != '\n')); pcVar9 = pcVar9 + 1) {
    }
    *pcVar9 = '\0';
    if ((char)((ulong)pcVar23 & 0xffffffff) != '\0') {
      pcStack_270 = (code *)0x10a51e;
      fprintf((FILE *)ofp,"#define BUILD_DATE \"%s\"\n",acStack_258);
      pcStack_270 = (code *)0x10a538;
      fprintf((FILE *)ofp,"#define BUILD_TIME (%ldL)\n",tStack_260);
      pcStack_270 = (code *)0x10a549;
      fputc(10,(FILE *)ofp);
    }
    uVar16 = 0x60000;
    if (version_0 == '\0') {
      uVar16 = 0;
    }
    pcStack_270 = (code *)0x10a56f;
    fprintf((FILE *)ofp,"#define VERSION_NUMBER 0x%08xU\n",uVar16);
    pcStack_270 = (code *)0x10a586;
    fprintf((FILE *)ofp,"#define VERSION_FEATURES 0x%08xU\n",0);
    pcStack_270 = (code *)0x10a5a1;
    fprintf((FILE *)ofp,"#define VERSION_SANITY1 0x%08xU\n",(ulong)version_2);
    pcStack_270 = (code *)0x10a5b2;
    fputc(10,(FILE *)ofp);
    pFVar5 = ofp;
    pcStack_270 = (code *)0x10a5df;
    sprintf(acStack_198,"%d.%d.%d",0,6,0);
    pcStack_270 = (code *)0x10a5f3;
    fprintf((FILE *)pFVar5,"#define VERSION_STRING \"%s\"\n",acStack_198);
    pFVar5 = ofp;
    auStack_1d8[0] = 0;
    pcStack_270 = (code *)0x10a623;
    sprintf(acStack_218,"%d.%d.%d",0,6,0);
    pcStack_270 = (code *)0x10a646;
    sprintf(acStack_198,"%s DynaHack%s Version %s - last build %s.","Unix",auStack_1d8,acStack_218,
            acStack_258);
    pcStack_270 = (code *)0x10a65a;
    fprintf((FILE *)pFVar5,"#define VERSION_ID \\\n \"%s\"\n",acStack_198);
    pcStack_270 = (code *)0x10a66b;
    fputc(10,(FILE *)ofp);
    pcStack_270 = (code *)0x10a677;
    fclose((FILE *)ofp);
    return;
  }
  pcStack_270 = do_permonst;
  pcVar9 = pcVar11;
  do_date_cold_1();
  pcVar24 = "w+";
  pcStack_2a8 = (code *)0x10a6aa;
  uStack_298 = (ulong)pcVar23 & 0xffffffff;
  pcStack_290 = unaff_R12;
  pdStack_288 = unaff_R13;
  pcStack_280 = pcVar11;
  pmStack_278 = unaff_R15;
  pcStack_270 = (code *)unaff_RBP;
  ofp = (FILE *)fopen(pcVar9,"w+");
  if ((FILE *)ofp != (FILE *)0x0) {
    pcStack_2a8 = (code *)0x10a6c9;
    fputs("/* This source file is generated by \'makedefs\'.  Do not edit. */\n",(FILE *)ofp);
    pcStack_2a8 = (code *)0x10a6e6;
    fwrite("#ifndef PM_H\n#define PM_H\n",0x1a,1,(FILE *)ofp);
    pcStack_2a8 = (code *)0x10a6fc;
    iVar7 = strcmp("giant ant","playermon");
    if (iVar7 != 0) {
      pcStack_2a8 = (code *)0x10a71d;
      fwrite("\n#define\tPM_PLAYERMON\t(-1)",0x1a,1,(FILE *)ofp);
    }
    cVar31 = '\x01';
    uVar20 = 0;
    ppVar30 = mons;
    do {
      pcStack_2a8 = (code *)0x10a75a;
      fwrite("\n#define\tPM_",0xc,1,(FILE *)ofp);
      if (cVar31 == '5') {
        pcStack_2a8 = (code *)0x10a775;
        iVar7 = strncmp(ppVar30->mname,"were",4);
        if (iVar7 == 0) {
          pcStack_2a8 = (code *)0x10a796;
          fwrite("HUMAN_",6,1,(FILE *)ofp);
        }
      }
      pcStack_2a8 = (code *)0x10a7a7;
      strncpy(&tmpdup_buf,ppVar30->mname,0x7f);
      if (tmpdup_buf != '\0') {
        pcVar9 = &DAT_0014f2b1;
        cVar31 = tmpdup_buf;
        do {
          if ((byte)(cVar31 + 0x9fU) < 0x1a) {
            cVar14 = cVar31 + -0x20;
LAB_0010a7d1:
            pcVar9[-1] = cVar14;
          }
          else {
            cVar14 = '_';
            if ((byte)(cVar31 + 0xa5U) < 0xe6) goto LAB_0010a7d1;
          }
          cVar31 = *pcVar9;
          pcVar9 = pcVar9 + 1;
        } while (cVar31 != '\0');
      }
      pcStack_2a8 = (code *)0x10a7f3;
      fprintf((FILE *)ofp,"%s\t%d",&tmpdup_buf,uVar20 & 0xffffffff);
      uVar20 = uVar20 + 1;
      ppVar30 = mons + uVar20;
      cVar31 = mons[uVar20].mlet;
      if (cVar31 == '\0') {
        pcStack_2a8 = (code *)0x10a82a;
        fprintf((FILE *)ofp,"\n\n#define\tNUMMONS\t%d\n",uVar20 & 0xffffffff);
        pcStack_2a8 = (code *)0x10a847;
        fwrite("\n#endif /* PM_H */\n",0x13,1,(FILE *)ofp);
        fclose((FILE *)ofp);
        return;
      }
    } while( true );
  }
  pcStack_2a8 = do_questtxt;
  __filename_00 = (msghdr *)pcVar24;
  pcVar23 = pcVar9;
  do_permonst_cold_1();
  pcVar24 = "r";
  pcStack_3f0 = (code *)0x10a88c;
  pcStack_2d0 = pcVar9;
  pcStack_2c8 = unaff_R12;
  pdStack_2c0 = unaff_R13;
  pcStack_2b8 = pcVar11;
  pmStack_2b0 = unaff_R15;
  pcStack_2a8 = (code *)unaff_RBP;
  ifp = (FILE *)fopen(pcVar23,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010ae5c:
    pcStack_3f0 = (code *)0x10ae64;
    do_questtxt_cold_7();
  }
  else {
    pcVar24 = "w+";
    pcStack_3f0 = (code *)0x10a8ab;
    ofp = (FILE *)fopen((char *)__filename_00,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      qt_hdr.n_hdr = 0;
      qt_line = 0;
      in_msg = '\0';
      pcStack_3f0 = (code *)0x10a8e8;
      pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
      if (pcVar9 != (char *)0x0) {
        unaff_R12 = "%s %5d";
        unaff_R13 = adStack_3d8;
        unaff_RBP = &iStack_3dc;
        unaff_R15 = msg_hdr;
        do {
          qt_line = qt_line + 1;
          pcVar23 = (char *)(ulong)(uint)qt_line;
          if (in_line[0] != '#') {
            if ((in_line[0] == '%') && ((in_line[1] == 'E' || (in_line[1] == 'C')))) {
              iStack_3dc = 0;
              if (in_line[1] == 'E') {
                if (in_msg != '\0') {
                  in_msg = '\0';
                  goto LAB_0010aae4;
                }
                pcVar9 = "End record encountered before message - line %d\n";
              }
              else if (in_line[1] == 'C') {
                if (in_msg == '\0') {
                  in_msg = '\x01';
                  pcStack_3f0 = (code *)0x10a99b;
                  iVar7 = __isoc99_sscanf(in_line + 4,"%s %5d",unaff_R13,unaff_RBP);
                  if (iVar7 == 2) {
                    pcStack_3f0 = (code *)0x10a9ac;
                    iVar8 = get_hdr((char *)unaff_R13);
                    iVar7 = qt_hdr.n_hdr;
                    if (iVar8 == 0) {
                      pcVar23 = (char *)(long)qt_hdr.n_hdr;
                      if ((long)pcVar23 < 0x10) {
                        pcStack_3f0 = (code *)0x10a9e1;
                        strncpy(qt_hdr.id[(long)pcVar23],(char *)unaff_R13,3);
                        lVar15 = (long)qt_hdr.n_hdr;
                        msg_hdr[lVar15].n_msg = 0;
                        qt_hdr.n_hdr = qt_hdr.n_hdr + 1;
                        qt_hdr.offset[lVar15] = 0;
                      }
                      else {
                        pcStack_3f0 = (code *)0x10ab8c;
                        do_questtxt_cold_2();
                      }
                      if (0xf < iVar7) goto LAB_0010aae4;
                    }
                    pcStack_3f0 = (code *)0x10aa22;
                    iVar7 = get_hdr((char *)unaff_R13);
                    lVar15 = (long)(iVar7 + -1);
                    lVar12 = lVar15 * 0x2ee8 + 0x1203f8;
                    iVar7 = msg_hdr[lVar15].n_msg;
                    lVar25 = (long)iVar7;
                    if (0 < lVar25) {
                      lVar26 = 0;
                      do {
                        if (*(int *)(lVar12 + lVar26) == iStack_3dc) {
                          pcStack_3f0 = (code *)0x10ab82;
                          do_questtxt_cold_4();
                          goto LAB_0010aae4;
                        }
                        lVar26 = lVar26 + 0x18;
                      } while (lVar25 * 0x18 != lVar26);
                    }
                    if (iVar7 < 500) {
                      msg_hdr[lVar15].n_msg = iVar7 + 1;
                      curr_msg = (qtmsg *)(lVar12 + lVar25 * 0x18);
                      curr_msg->msgnum = iStack_3dc;
                      curr_msg->delivery = in_line[2];
                      curr_msg->offset = 0;
                      curr_msg->size = 0;
                    }
                    else {
                      pcStack_3f0 = (code *)0x10ab78;
                      do_questtxt_cold_3();
                    }
                  }
                  else {
                    pcStack_3f0 = (code *)0x10ab6e;
                    do_questtxt_cold_1();
                  }
                  goto LAB_0010aae4;
                }
                pcVar9 = "Control record encountered during message - line %d\n";
              }
              else {
                pcVar9 = "Unrecognized Control record at line %d\n";
              }
              pcStack_3f0 = (code *)0x10ab64;
              fprintf(_stderr,pcVar9,(ulong)(uint)qt_line);
            }
            else {
              if (in_msg == '\0') {
                pcStack_3f0 = (code *)0x10aab0;
                sVar10 = strlen(in_line);
                if (sVar10 == 1) goto LAB_0010aae4;
              }
              if (in_msg == '\0') {
                pcStack_3f0 = (code *)0x10ab21;
                fprintf(_stderr,"Text encountered outside message - line %d\n",pcVar23);
              }
              pcStack_3f0 = (code *)0x10aac7;
              sVar10 = strlen(in_line);
              curr_msg->size = curr_msg->size + sVar10;
            }
          }
LAB_0010aae4:
          pcStack_3f0 = (code *)0x10aaf8;
          pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
          __filename_00 = (msghdr *)in_line;
        } while (pcVar9 != (char *)0x0);
      }
      pcStack_3f0 = (code *)0x10aba1;
      fseek((FILE *)ifp,0,0);
      iVar7 = qt_hdr.n_hdr;
      in_msg = '\0';
      lVar15 = (long)qt_hdr.n_hdr;
      lVar12 = lVar15 * 0xb + 4;
      if (0 < lVar15) {
        plVar18 = qt_hdr.offset;
        lVar25 = 0;
        do {
          *plVar18 = lVar12;
          lVar12 = lVar12 + (long)*(int *)((long)msg_hdr[0].qt_msg + lVar25 + -8) * 0x18 + 4;
          lVar25 = lVar25 + 0x2ee8;
          plVar18 = plVar18 + 1;
        } while (lVar15 * 0x2ee8 - lVar25 != 0);
      }
      if (0 < iVar7) {
        lVar25 = 0x120408;
        lVar26 = 0;
        lVar27 = 0;
        do {
          iVar7 = msg_hdr[lVar26].n_msg;
          if (0 < (long)iVar7) {
            lVar28 = 0;
            do {
              *(long *)(lVar25 + -8 + lVar28) = lVar27 + lVar12;
              lVar27 = lVar27 + *(long *)(lVar25 + lVar28);
              lVar28 = lVar28 + 0x18;
            } while ((long)iVar7 * 0x18 != lVar28);
          }
          lVar26 = lVar26 + 1;
          lVar25 = lVar25 + 0x2ee8;
        } while (lVar26 != lVar15);
      }
      pcVar24 = (char *)0x4;
      pcStack_3f0 = (code *)0x10ac6e;
      sVar10 = fwrite(&qt_hdr,4,1,(FILE *)ofp);
      if ((int)sVar10 == 1) {
        pcVar24 = (char *)0x3;
        pcStack_3f0 = (code *)0x10ac96;
        sVar10 = fwrite(qt_hdr.id,3,(long)qt_hdr.n_hdr,(FILE *)ofp);
        if (qt_hdr.n_hdr == (int)sVar10) {
          pcVar24 = (char *)0x8;
          pcStack_3f0 = (code *)0x10acbd;
          sVar10 = fwrite(qt_hdr.offset,8,(long)qt_hdr.n_hdr,(FILE *)ofp);
          if (qt_hdr.n_hdr == (int)sVar10) {
            if (0 < qt_hdr.n_hdr) {
              __filename_00 = msg_hdr;
              pcVar23 = (char *)0x0;
              do {
                pcVar24 = (char *)0x4;
                pcStack_3f0 = (code *)0x10acf2;
                sVar10 = fwrite(__filename_00,4,1,(FILE *)ofp);
                if ((int)sVar10 != 1) goto LAB_0010ae57;
                pcVar24 = (char *)0x18;
                pcStack_3f0 = (code *)0x10ad13;
                sVar10 = fwrite(__filename_00->qt_msg,0x18,(long)__filename_00->n_msg,(FILE *)ofp);
                if (__filename_00->n_msg != (int)sVar10) goto LAB_0010ae57;
                pcVar23 = pcVar23 + 1;
                __filename_00 = __filename_00 + 1;
              } while ((long)pcVar23 < (long)qt_hdr.n_hdr);
            }
            pcStack_3f0 = (code *)0x10ad49;
            pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
            bVar22 = in_line[0];
            do {
              in_line[0] = bVar22;
              if (pcVar9 == (char *)0x0) {
                pcStack_3f0 = (code *)0x10ae39;
                fclose((FILE *)ifp);
                pcStack_3f0 = (code *)0x10ae45;
                fclose((FILE *)ofp);
                return;
              }
              if (bVar22 != 0x23) {
                if ((bVar22 == 0x25) && ((in_line[1] == 'E' || (in_line[1] == 'C')))) {
                  in_msg = in_line[1] == 'C';
                }
                else {
                  if (in_msg == '\0') {
                    pcStack_3f0 = (code *)0x10adbf;
                    sVar10 = strlen(in_line);
                    if (sVar10 == 1) goto LAB_0010ae10;
                  }
                  pbVar13 = &xcrypt_buf;
                  if (bVar22 != 0) {
                    iVar7 = 1;
                    pcVar9 = in_line;
                    pbVar13 = &xcrypt_buf;
                    do {
                      pcVar9 = (char *)((byte *)pcVar9 + 1);
                      bVar21 = (byte)iVar7;
                      if ((bVar22 & 0x60) == 0) {
                        bVar21 = 0;
                      }
                      *pbVar13 = bVar21 ^ bVar22;
                      iVar7 = iVar7 * 2;
                      if (0x1f < iVar7) {
                        iVar7 = 1;
                      }
                      pbVar13 = pbVar13 + 1;
                      bVar22 = *pcVar9;
                    } while (bVar22 != 0);
                  }
                  *pbVar13 = 0;
                  pcStack_3f0 = (code *)0x10ae10;
                  fputs(&xcrypt_buf,(FILE *)ofp);
                }
              }
LAB_0010ae10:
              pcStack_3f0 = (code *)0x10ae24;
              pcVar9 = fgets(in_line,0x50,(FILE *)ifp);
              bVar22 = in_line[0];
            } while( true );
          }
        }
      }
LAB_0010ae57:
      pcStack_3f0 = (code *)0x10ae5c;
      do_questtxt_cold_5();
      goto LAB_0010ae5c;
    }
  }
  pcStack_3f0 = do_rumors;
  __filename_01 = __filename_00;
  do_questtxt_cold_6();
  pcStack_428 = (code *)0x10ae8f;
  pcStack_420 = extraout_RAX_00;
  pmStack_418 = __filename_00;
  pcStack_410 = unaff_R12;
  pdStack_408 = unaff_R13;
  pcStack_400 = pcVar23;
  pmStack_3f8 = unaff_R15;
  pcStack_3f0 = (code *)unaff_RBP;
  ofp = (FILE *)fopen(__filename,"w+");
  pcVar9 = __filename;
  if ((FILE *)ofp == (FILE *)0x0) {
    pcStack_428 = (code *)0x10b0bf;
    do_rumors_cold_3();
LAB_0010b0bf:
    pcStack_428 = (code *)0x10b0cb;
    do_rumors_cold_2();
  }
  else {
    pcStack_428 = (code *)0x10aeb2;
    pcStack_420 = __filename;
    fputs("#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",(FILE *)ofp);
    pcStack_428 = (code *)0x10aec1;
    ifp = (FILE *)fopen((char *)__filename_01,"r");
    if ((FILE *)ifp == (FILE *)0x0) goto LAB_0010b0bf;
    unaff_R13 = (deflist *)0x0;
    pcStack_428 = (code *)0x10aee3;
    fseek((FILE *)ifp,0,2);
    pcStack_428 = (code *)0x10aeef;
    lVar15 = ftell((FILE *)ifp);
    pcStack_428 = (code *)0x10af07;
    fprintf((FILE *)ofp,"%06lx\n",lVar15);
    pcStack_428 = (code *)0x10af17;
    fseek((FILE *)ifp,0,0);
    pcStack_428 = (code *)0x10af2f;
    pcVar23 = fgets(in_line,0x100,(FILE *)ifp);
    if (pcVar23 != (char *)0x0) {
      __filename_01 = (msghdr *)&xcrypt_buf;
      unaff_R12 = in_line;
      unaff_RBP = (int *)(in_line + 1);
      pcVar9 = (char *)0x1;
      do {
        pbVar13 = &xcrypt_buf;
        if (in_line[0] != '\0') {
          iVar7 = 1;
          pcVar23 = in_line;
          pbVar13 = &xcrypt_buf;
          bVar22 = in_line[0];
          do {
            pcVar23 = (char *)((byte *)pcVar23 + 1);
            bVar21 = (byte)iVar7;
            if ((bVar22 & 0x60) == 0) {
              bVar21 = 0;
            }
            *pbVar13 = bVar21 ^ bVar22;
            iVar7 = iVar7 * 2;
            if (0x1f < iVar7) {
              iVar7 = 1;
            }
            pbVar13 = pbVar13 + 1;
            bVar22 = *pcVar23;
          } while (bVar22 != 0);
        }
        *pbVar13 = 0;
        pcStack_428 = (code *)0x10afa4;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_428 = (code *)0x10afb8;
        pcVar23 = fgets(in_line,0x100,(FILE *)ifp);
      } while (pcVar23 != (char *)0x0);
    }
    pcStack_428 = (code *)0x10afc9;
    fclose((FILE *)ifp);
    pcStack_428 = (code *)0x10afd8;
    ifp = (FILE *)fopen(pcVar24,"r");
    if ((FILE *)ifp != (FILE *)0x0) {
      pcStack_428 = (code *)0x10b000;
      pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
      bVar22 = in_line[0];
      while (in_line[0] = bVar22, pcVar9 != (char *)0x0) {
        pbVar13 = &xcrypt_buf;
        if (bVar22 != 0) {
          iVar7 = 1;
          pcVar9 = in_line;
          pbVar13 = &xcrypt_buf;
          do {
            pcVar9 = (char *)((byte *)pcVar9 + 1);
            bVar21 = (byte)iVar7;
            if ((bVar22 & 0x60) == 0) {
              bVar21 = 0;
            }
            *pbVar13 = bVar21 ^ bVar22;
            iVar7 = iVar7 * 2;
            if (0x1f < iVar7) {
              iVar7 = 1;
            }
            pbVar13 = pbVar13 + 1;
            bVar22 = *pcVar9;
          } while (bVar22 != 0);
        }
        *pbVar13 = 0;
        pcStack_428 = (code *)0x10b078;
        fputs(&xcrypt_buf,(FILE *)ofp);
        pcStack_428 = (code *)0x10b08c;
        pcVar9 = fgets(in_line,0x100,(FILE *)ifp);
        bVar22 = in_line[0];
      }
      pcStack_428 = (code *)0x10b09d;
      fclose((FILE *)ifp);
      fclose((FILE *)ofp);
      return;
    }
  }
  pcStack_428 = do_oracles;
  pcVar23 = pcStack_420;
  pcVar11 = pcVar24;
  do_rumors_cold_1();
  pcStack_450 = pcVar9;
  pcStack_448 = unaff_R12;
  pdStack_440 = unaff_R13;
  pcStack_438 = pcVar24;
  pmStack_430 = __filename_01;
  pcStack_428 = (code *)unaff_RBP;
  sprintf(acStack_658,"%s.%s",pcVar23,"tmp");
  ifp = (FILE *)fopen(pcVar11,"r");
  if ((FILE *)ifp == (FILE *)0x0) {
LAB_0010b5e8:
    do_oracles_cold_4();
  }
  else {
    ofp = (FILE *)fopen(pcVar23,"w+");
    if ((FILE *)ofp != (FILE *)0x0) {
      tfp = (FILE *)fopen(acStack_658,"w+");
      if ((FILE *)tfp != (FILE *)0x0) {
        fprintf((FILE *)ofp,"%s%5d\n",
                "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",0);
        fputs("---\n",(FILE *)tfp);
        pFVar5 = ofp;
        lVar15 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar5,"%05lx\n",lVar15);
        lVar15 = 0;
        do {
          pbVar13 = (byte *)special_oracle[lVar15];
          bVar22 = *pbVar13;
          pbVar17 = &xcrypt_buf;
          if (bVar22 != 0) {
            iVar7 = 1;
            pbVar17 = &xcrypt_buf;
            do {
              pbVar13 = pbVar13 + 1;
              bVar21 = (byte)iVar7;
              if ((bVar22 & 0x60) == 0) {
                bVar21 = 0;
              }
              *pbVar17 = bVar21 ^ bVar22;
              iVar7 = iVar7 * 2;
              if (0x1f < iVar7) {
                iVar7 = 1;
              }
              pbVar17 = pbVar17 + 1;
              bVar22 = *pbVar13;
            } while (bVar22 != 0);
          }
          *pbVar17 = 0;
          fputs(&xcrypt_buf,(FILE *)tfp);
          fputc(10,(FILE *)tfp);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 10);
        fputs("---\n",(FILE *)tfp);
        pFVar5 = ofp;
        lVar15 = ftell((FILE *)tfp);
        fprintf((FILE *)pFVar5,"%05lx\n",lVar15);
        uVar19 = 1;
LAB_0010b2a1:
        bVar3 = true;
LAB_0010b2a4:
        while (pcVar9 = fgets(in_line,0x100,(FILE *)ifp), pcVar9 != (char *)0x0) {
          if (in_line[0] != '#') {
            __isoc99_sscanf(in_line,"----- %s",alStack_558);
            if (in_line[4] == '-' &&
                CONCAT13(in_line[3],CONCAT12(in_line[2],CONCAT11(in_line[1],in_line[0]))) ==
                0x2d2d2d2d) goto code_r0x0010b2f0;
            pbVar13 = &xcrypt_buf;
            if (in_line[0] != '\0') {
              iVar7 = 1;
              pcVar9 = in_line;
              pbVar13 = &xcrypt_buf;
              bVar22 = in_line[0];
              do {
                pcVar9 = (char *)((byte *)pcVar9 + 1);
                bVar21 = (byte)iVar7;
                if ((bVar22 & 0x60) == 0) {
                  bVar21 = 0;
                }
                *pbVar13 = bVar21 ^ bVar22;
                iVar7 = iVar7 * 2;
                if (0x1f < iVar7) {
                  iVar7 = 1;
                }
                pbVar13 = pbVar13 + 1;
                bVar22 = *pcVar9;
              } while (bVar22 != 0);
            }
            *pbVar13 = 0;
            fputs(&xcrypt_buf,(FILE *)tfp);
            bVar3 = false;
          }
        }
        if (!bVar3) {
          uVar19 = uVar19 + 1;
          fputs("---\n",(FILE *)tfp);
          pFVar5 = ofp;
          lVar15 = ftell((FILE *)tfp);
          fprintf((FILE *)pFVar5,"%05lx\n",lVar15);
        }
        lVar15 = ftell((FILE *)ofp);
        fclose((FILE *)ifp);
        sprintf(in_line,"rewind of \"%s\"",acStack_658);
        iVar7 = fseek((FILE *)tfp,0,0);
        if (iVar7 == 0) {
          pcVar9 = fgets(in_line,0x100,(FILE *)tfp);
          while (pcVar9 != (char *)0x0) {
            fputs(in_line,(FILE *)ofp);
            pcVar9 = fgets(in_line,0x100,(FILE *)tfp);
          }
          fclose((FILE *)tfp);
          unlink(acStack_658);
          sprintf(in_line,"rewind of \"%s\"",pcVar23);
          iVar7 = fseek((FILE *)ofp,0,0);
          if (iVar7 == 0) {
            sprintf(in_line,"header rewrite of \"%s\"",pcVar23);
            iVar7 = fprintf((FILE *)ofp,"%s%5d\n",
                            "#\tThis data file is generated by \'makedefs\'.  Do not edit. \n",
                            (ulong)uVar19);
            if (-1 < iVar7) {
              sprintf(in_line,"data rewrite of \"%s\"",pcVar23);
              iVar7 = uVar19 + 1;
              while ((((lVar12 = ftell((FILE *)ofp), -1 < lVar12 &&
                       (iVar8 = fseek((FILE *)ofp,lVar12,0), -1 < iVar8)) &&
                      (iVar8 = __isoc99_fscanf(ofp,"%5lx",alStack_558), iVar8 == 1)) &&
                     ((iVar8 = fseek((FILE *)ofp,lVar12,0), -1 < iVar8 &&
                      (iVar8 = fprintf((FILE *)ofp,"%05lx\n",alStack_558[0] + lVar15), -1 < iVar8)))
                     )) {
                iVar7 = iVar7 + -1;
                if (iVar7 == 0) {
                  fclose((FILE *)ofp);
                  return;
                }
              }
            }
          }
        }
        do_oracles_cold_1();
        goto LAB_0010b5e8;
      }
      goto LAB_0010b5f8;
    }
  }
  do_oracles_cold_3();
LAB_0010b5f8:
  pcVar9 = acStack_658;
  do_oracles_cold_2();
  lVar15 = (long)qt_hdr.n_hdr;
  if (0 < lVar15) {
    __s2 = qt_hdr.id;
    lVar12 = 0;
    do {
      iVar7 = strncmp(pcVar9,*__s2,3);
      if (iVar7 == 0) {
        return;
      }
      lVar12 = lVar12 + 1;
      __s2 = __s2 + 1;
    } while (lVar15 != lVar12);
  }
  return;
code_r0x0010b2f0:
  bVar2 = !bVar3;
  bVar3 = true;
  if (bVar2) goto LAB_0010b36b;
  goto LAB_0010b2a4;
LAB_0010b36b:
  uVar19 = uVar19 + 1;
  fputs("---\n",(FILE *)tfp);
  pFVar5 = ofp;
  lVar15 = ftell((FILE *)tfp);
  fprintf((FILE *)pFVar5,"%05lx\n",lVar15);
  goto LAB_0010b2a1;
}

Assistant:

void do_dungeon(const char *infile, const char *outfile)
{
	int rcnt = 0;

	if (!(ifp = fopen(infile, RDTMODE))) {
		perror(infile);
		exit(EXIT_FAILURE);
	}
	if (!(ofp = fopen(outfile, WRTMODE))) {
		perror(outfile);
		exit(EXIT_FAILURE);
	}
	
	fprintf(ofp, "%s", Dont_Edit_Data);

	while (fgets(in_line, sizeof in_line, ifp) != 0) {
	    rcnt++;
	    if (in_line[0] == '#') continue;	/* discard comments */
recheck:
	    if (in_line[0] == '%') {
		int i = check_control(in_line);
		if (i >= 0) {
		    if (!deflist[i].true_or_false)  {
			while (fgets(in_line, sizeof in_line, ifp) != 0)
			    if (check_control(in_line) != i) goto recheck;
		    } else
			fputs(without_control(in_line),ofp);
		} else {
		    fprintf(stderr, "Unknown control option '%s' in file %s at line %d.\n",
			    in_line, infile, rcnt);
		    exit(EXIT_FAILURE);
		}
	    } else
		fputs(in_line,ofp);
	}
	fclose(ifp);
	fclose(ofp);

	return;
}